

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  sbyte sVar8;
  undefined8 uVar9;
  seq_t sequence;
  U32 i;
  long lVar10;
  ulong uVar11;
  BYTE *pBVar12;
  BYTE *oend_00;
  BYTE *pBVar13;
  ulong uVar14;
  BYTE *oend;
  BYTE *__dest;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  int iVar18;
  uint uVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *litPtr;
  BYTE *local_f8;
  BIT_DStream_t local_f0;
  ZSTD_fseState local_c8;
  ZSTD_fseState local_b8;
  ZSTD_fseState local_a8;
  size_t local_98 [3];
  BYTE *local_80 [4];
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ulong local_48;
  size_t sStack_40;
  size_t local_38;
  
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    oend_00 = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    oend_00 = dctx->litBuffer;
  }
  local_f8 = dctx->litPtr;
  sVar17 = dctx->litSize;
  pBVar12 = local_f8 + sVar17;
  pBVar20 = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_001c4e63:
    uVar14 = (long)pBVar12 - (long)local_f8;
    sVar16 = 0xffffffffffffffba;
    if (uVar14 <= (ulong)((long)oend_00 - (long)pBVar20)) {
      if (pBVar20 == (BYTE *)0x0) {
        pBVar20 = (BYTE *)0x0;
      }
      else {
        memcpy(pBVar20,local_f8,uVar14);
        pBVar20 = pBVar20 + uVar14;
      }
      sVar16 = (long)pBVar20 - (long)dst;
    }
  }
  else {
    local_58 = (BYTE *)dctx->prefixStart;
    local_60 = (BYTE *)dctx->virtualStart;
    local_80[3] = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar10 = -0xc;
    do {
      *(ulong *)((long)local_80 + lVar10 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar10);
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0);
    sVar16 = 0xffffffffffffffec;
    if (seqSize != 0) {
      local_f0.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_f0.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_f0.bitContainer =
               local_f0.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_f0.bitContainer =
               local_f0.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_f0.bitContainer =
               local_f0.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_f0.bitContainer =
               local_f0.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_f0.bitContainer =
               local_f0.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_f0.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_f0.bitContainer;
        }
        bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar2 != 0) {
          local_f0.bitsConsumed = LZCOUNT((uint)bVar2) + (int)seqSize * -8 + 0x29;
          local_f0.ptr = (char *)seqStart;
          goto LAB_001c46b3;
        }
      }
      else {
        local_f0.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_f0.bitContainer = *(size_t *)local_f0.ptr;
        if ((local_f0.bitContainer >> 0x38 != 0) &&
           (local_f0.bitsConsumed =
                 (LZCOUNT((uint)(byte)(local_f0.bitContainer >> 0x38)) ^ 0xffffffe0U) + 9,
           seqSize < 0xffffffffffffff89)) {
LAB_001c46b3:
          local_f0.start = (char *)seqStart;
          local_80[0] = local_f8 + sVar17;
          local_80[2] = (BYTE *)dst;
          ZSTD_initFseState(&local_c8,&local_f0,dctx->LLTptr);
          ZSTD_initFseState(&local_b8,&local_f0,dctx->OFTptr);
          ZSTD_initFseState(&local_a8,&local_f0,dctx->MLTptr);
          if (local_80[2] == (BYTE *)0x0) {
            __assert_fail("dst != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xaabe,
                          "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                         );
          }
          local_50 = oend_00 + -0x20;
          pBVar20 = local_80[2];
LAB_001c4769:
          do {
            pBVar12 = local_58;
            sVar17 = local_98[1];
            bVar2 = local_c8.table[local_c8.state].nbAdditionalBits;
            if (0x10 < bVar2) {
              __assert_fail("llBits <= MaxLLBits",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa948,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            local_80[1] = pBVar20;
            bVar3 = local_a8.table[local_a8.state].nbAdditionalBits;
            if (0x10 < bVar3) {
              __assert_fail("mlBits <= MaxMLBits",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa949,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            bVar4 = local_b8.table[local_b8.state].nbAdditionalBits;
            if (0x1f < bVar4) {
              __assert_fail("ofBits <= MaxOff",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa94a,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            uVar14 = (ulong)local_a8.table[local_a8.state].baseValue;
            uVar19 = local_c8.table[local_c8.state].baseValue;
            local_48 = (ulong)uVar19;
            bVar5 = local_c8.table[local_c8.state].nbBits;
            bVar6 = local_a8.table[local_a8.state].nbBits;
            bVar7 = local_b8.table[local_b8.state].nbBits;
            if (bVar4 < 2) {
              if (bVar4 != 0) {
                uVar11 = (ulong)local_f0.bitsConsumed;
                local_f0.bitsConsumed = local_f0.bitsConsumed + 1;
                lVar10 = (ulong)(local_b8.table[local_b8.state].baseValue + (uint)(uVar19 == 0)) -
                         ((long)(local_f0.bitContainer << (uVar11 & 0x3f)) >> 0x3f);
                if (lVar10 == 3) {
                  local_38 = (local_98[0] - 1) + (ulong)(local_98[0] == 1);
LAB_001c4d97:
                  local_98[2] = local_98[1];
                }
                else {
                  local_38 = local_98[lVar10] + (ulong)(local_98[lVar10] == 0);
                  if (lVar10 != 1) goto LAB_001c4d97;
                }
                local_98[1] = local_98[0];
                goto LAB_001c4837;
              }
              local_38 = local_98[uVar19 == 0];
              local_98[1] = local_98[uVar19 != 0];
              local_98[0] = local_38;
            }
            else {
              uVar11 = (ulong)local_f0.bitsConsumed;
              local_f0.bitsConsumed = local_f0.bitsConsumed + bVar4;
              local_38 = ((local_f0.bitContainer << (uVar11 & 0x3f)) >> ((ulong)(byte)-bVar4 & 0x3f)
                         ) + (ulong)local_b8.table[local_b8.state].baseValue;
              local_98[1] = local_98[0];
              local_98[2] = sVar17;
LAB_001c4837:
              local_98[1] = local_98[0];
              local_98[0] = local_38;
            }
            uVar11 = (ulong)local_f0.bitsConsumed;
            if (bVar3 != 0) {
              uVar15 = uVar11 & 0x3f;
              uVar11 = (ulong)(local_f0.bitsConsumed + bVar3);
              uVar14 = uVar14 + ((local_f0.bitContainer << uVar15) >> ((ulong)(byte)-bVar3 & 0x3f));
            }
            if ((0x1e < (byte)(bVar3 + bVar2 + bVar4)) && (uVar19 = (uint)uVar11, uVar19 < 0x41)) {
              if (local_f0.ptr < local_f0.limitPtr) {
                if (local_f0.ptr == local_f0.start) goto LAB_001c48a7;
                uVar15 = (ulong)(uint)((int)local_f0.ptr - (int)local_f0.start);
                if (local_f0.start <= (ulong *)((long)local_f0.ptr - (uVar11 >> 3))) {
                  uVar15 = uVar11 >> 3;
                }
                uVar19 = uVar19 + (int)uVar15 * -8;
              }
              else {
                uVar15 = uVar11 >> 3;
                uVar19 = uVar19 & 7;
              }
              local_f0.ptr = (char *)((long)local_f0.ptr - uVar15);
              uVar11 = (ulong)uVar19;
              local_f0.bitContainer = *(size_t *)local_f0.ptr;
            }
LAB_001c48a7:
            iVar18 = (int)uVar11;
            if (bVar2 != 0) {
              iVar18 = iVar18 + (uint)bVar2;
              local_48 = local_48 +
                         ((local_f0.bitContainer << (uVar11 & 0x3f)) >> ((ulong)(byte)-bVar2 & 0x3f)
                         );
            }
            sVar8 = (bVar5 < 0x41) * ('@' - bVar5);
            local_c8.state =
                 (((local_f0.bitContainer >> ((ulong)(byte)-(char)(iVar18 + (uint)bVar5) & 0x3f)) <<
                  sVar8) >> sVar8) + (ulong)local_c8.table[local_c8.state].nextState;
            iVar18 = iVar18 + (uint)bVar5 + (uint)bVar6;
            sVar8 = (bVar6 < 0x41) * ('@' - bVar6);
            local_a8.state =
                 (((local_f0.bitContainer >> ((ulong)(byte)-(char)iVar18 & 0x3f)) << sVar8) >> sVar8
                 ) + (ulong)local_a8.table[local_a8.state].nextState;
            local_f0.bitsConsumed = iVar18 + (uint)bVar7;
            sVar8 = (bVar7 < 0x41) * ('@' - bVar7);
            local_b8.state =
                 (((local_f0.bitContainer >> ((ulong)(byte)-(char)local_f0.bitsConsumed & 0x3f)) <<
                  sVar8) >> sVar8) + (ulong)local_b8.table[local_b8.state].nextState;
            sStack_40 = uVar14;
            pBVar13 = local_f8 + local_48;
            local_98[0] = local_38;
            if (local_80[0] < pBVar13) {
LAB_001c4b55:
              sequence.matchLength = uVar14;
              sequence.litLength = local_48;
              sequence.offset = local_38;
              uVar11 = ZSTD_execSequenceEnd
                                 (pBVar20,oend_00,sequence,&local_f8,local_80[0],local_58,local_60,
                                  local_80[3]);
            }
            else {
              uVar11 = local_48 + uVar14;
              pBVar1 = pBVar20 + uVar11;
              if (local_50 < pBVar1) goto LAB_001c4b55;
              if ((long)local_48 < 0) {
                __assert_fail("op <= oLitEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa863,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if ((long)uVar11 <= (long)local_48) {
                __assert_fail("oLitEnd < oMatchEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa864,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (oend_00 < pBVar1) {
                __assert_fail("oMatchEnd <= oend",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa865,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              __dest = pBVar20 + local_48;
              if (local_50 < __dest) {
                __assert_fail("oLitEnd <= oend_w",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa867,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              uVar9 = *(undefined8 *)(local_f8 + 8);
              *(undefined8 *)pBVar20 = *(undefined8 *)local_f8;
              *(undefined8 *)(pBVar20 + 8) = uVar9;
              sVar17 = local_38;
              if (0x10 < local_48) {
                if ((BYTE *)0xffffffffffffffe0 < pBVar20 + 0x10 + (-0x10 - (long)(local_f8 + 0x10)))
                goto LAB_001c4f96;
                uVar9 = *(undefined8 *)(local_f8 + 0x18);
                *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(local_f8 + 0x10);
                *(undefined8 *)(pBVar20 + 0x18) = uVar9;
                if (0x20 < local_48) {
                  lVar10 = 0;
                  do {
                    uVar9 = *(undefined8 *)(local_f8 + lVar10 + 0x20 + 8);
                    pBVar21 = pBVar20 + lVar10 + 0x20;
                    *(undefined8 *)pBVar21 = *(undefined8 *)(local_f8 + lVar10 + 0x20);
                    *(undefined8 *)(pBVar21 + 8) = uVar9;
                    uVar9 = *(undefined8 *)(local_f8 + lVar10 + 0x30 + 8);
                    *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(local_f8 + lVar10 + 0x30);
                    *(undefined8 *)(pBVar21 + 0x18) = uVar9;
                    lVar10 = lVar10 + 0x20;
                    sVar17 = local_38;
                  } while (pBVar21 + 0x20 < __dest);
                }
              }
              pBVar21 = __dest + -local_38;
              local_f8 = pBVar13;
              if ((ulong)((long)__dest - (long)local_58) < sVar17) {
                if ((ulong)((long)__dest - (long)local_60) < sVar17) {
                  return 0xffffffffffffffec;
                }
                lVar10 = (long)(__dest + -local_38) - (long)local_58;
                pBVar20 = local_80[3] + lVar10;
                if (local_80[3] < pBVar20 + uVar14) {
                  memmove(__dest,pBVar20,-lVar10);
                  __dest = __dest + -lVar10;
                  uVar14 = uVar14 + lVar10;
                  sStack_40 = uVar14;
                  pBVar21 = pBVar12;
                  goto LAB_001c4a37;
                }
                memmove(__dest,pBVar20,uVar14);
                pBVar20 = local_80[1];
              }
              else {
LAB_001c4a37:
                sStack_40 = uVar14;
                if (pBVar1 < __dest) {
                  __assert_fail("op <= oMatchEnd",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa888,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (pBVar21 < pBVar12) {
                  __assert_fail("match >= prefixStart",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa88a,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (uVar14 == 0) {
                  __assert_fail("sequence.matchLength >= 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa88b,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                pBVar20 = local_80[1];
                if (sVar17 < 0x10) {
                  if (__dest < pBVar21) {
                    __assert_fail("*ip <= *op",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (sVar17 < 8) {
                    iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar17 * 4);
                    *__dest = *pBVar21;
                    __dest[1] = pBVar21[1];
                    __dest[2] = pBVar21[2];
                    __dest[3] = pBVar21[3];
                    pBVar12 = pBVar21 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar17 * 4);
                    pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar17 * 4)
                                        - (long)iVar18);
                    *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar12;
                  }
                  else {
                    *(undefined8 *)__dest = *(undefined8 *)pBVar21;
                  }
                  pBVar12 = pBVar21 + 8;
                  pBVar13 = __dest + 8;
                  if ((long)pBVar13 - (long)pBVar12 < 8) {
                    __assert_fail("*op - *ip >= 8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (8 < uVar14) {
                    if (pBVar1 <= pBVar13) {
                      __assert_fail("op < oMatchEnd",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xa89f,
                                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                   );
                    }
                    if ((ulong)((long)pBVar13 - (long)pBVar12) < 0x10) {
                      do {
                        *(undefined8 *)pBVar13 = *(undefined8 *)pBVar12;
                        pBVar13 = pBVar13 + 8;
                        pBVar12 = pBVar12 + 8;
                      } while (pBVar13 < __dest + uVar14);
                    }
                    else {
                      uVar9 = *(undefined8 *)(pBVar21 + 0x10);
                      *(undefined8 *)pBVar13 = *(undefined8 *)pBVar12;
                      *(undefined8 *)(__dest + 0x10) = uVar9;
                      if (0x18 < (long)uVar14) {
                        lVar10 = 0;
                        do {
                          uVar9 = *(undefined8 *)(pBVar21 + lVar10 + 0x18 + 8);
                          pBVar12 = __dest + lVar10 + 0x18;
                          *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar21 + lVar10 + 0x18);
                          *(undefined8 *)(pBVar12 + 8) = uVar9;
                          uVar9 = *(undefined8 *)(pBVar21 + lVar10 + 0x28 + 8);
                          *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar21 + lVar10 + 0x28)
                          ;
                          *(undefined8 *)(pBVar12 + 0x18) = uVar9;
                          lVar10 = lVar10 + 0x20;
                        } while (pBVar12 + 0x20 < __dest + uVar14);
                      }
                    }
                  }
                }
                else {
                  if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar21)) {
LAB_001c4f96:
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x36a6,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar9 = *(undefined8 *)(pBVar21 + 8);
                  *(undefined8 *)__dest = *(undefined8 *)pBVar21;
                  *(undefined8 *)(__dest + 8) = uVar9;
                  if (0x10 < (long)uVar14) {
                    lVar10 = 0x10;
                    do {
                      uVar9 = *(undefined8 *)(pBVar21 + lVar10 + 8);
                      pBVar12 = __dest + lVar10;
                      *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar21 + lVar10);
                      *(undefined8 *)(pBVar12 + 8) = uVar9;
                      uVar9 = *(undefined8 *)(pBVar21 + lVar10 + 0x10 + 8);
                      *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar21 + lVar10 + 0x10);
                      *(undefined8 *)(pBVar12 + 0x18) = uVar9;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar12 + 0x20 < __dest + uVar14);
                  }
                }
              }
            }
            if (0xffffffffffffff88 < uVar11) {
              return uVar11;
            }
            pBVar20 = pBVar20 + uVar11;
            nbSeq = nbSeq + -1;
            if (nbSeq == 0) {
              if ((local_f0.bitsConsumed < 0x41) &&
                 ((local_f0.bitsConsumed != 0x40 || local_f0.ptr != local_f0.start) ||
                  local_f0.limitPtr <= local_f0.ptr)) {
                return 0xffffffffffffffec;
              }
              lVar10 = 0;
              do {
                (dctx->entropy).rep[lVar10] = (U32)local_98[lVar10];
                lVar10 = lVar10 + 1;
                dst = local_80[2];
                pBVar12 = local_80[0];
              } while (lVar10 != 3);
              goto LAB_001c4e63;
            }
          } while (0x40 < local_f0.bitsConsumed);
          if (local_f0.ptr < local_f0.limitPtr) {
            if (local_f0.ptr == local_f0.start) goto LAB_001c4769;
            uVar14 = (ulong)(uint)((int)local_f0.ptr - (int)local_f0.start);
            if (local_f0.start <=
                (ulong *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
              uVar14 = (ulong)(local_f0.bitsConsumed >> 3);
            }
            local_f0.bitsConsumed = local_f0.bitsConsumed + (int)uVar14 * -8;
          }
          else {
            uVar14 = (ulong)(local_f0.bitsConsumed >> 3);
            local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
          }
          local_f0.ptr = (char *)((long)local_f0.ptr - uVar14);
          local_f0.bitContainer = *(size_t *)local_f0.ptr;
          goto LAB_001c4769;
        }
      }
    }
  }
  return sVar16;
}

Assistant:

DONT_VECTORIZE
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset,
                           const int frame)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}